

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_generator_next(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,
                         int magic)

{
  JSValue **ppJVar1;
  JSGeneratorStateEnum JVar2;
  JSGeneratorData *s;
  int64_t iVar3;
  JSValue *pJVar4;
  BOOL BVar5;
  undefined4 in_register_0000000c;
  JSValueUnion JVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  int *piVar8;
  JSValue JVar9;
  int64_t iStack_40;
  
  if (((int)this_val.tag != -1) || (*(short *)((long)this_val.u.ptr + 6) != 0x28)) {
    *pdone = 1;
LAB_0015a932:
    JS_ThrowTypeError(ctx,"not a generator",this_val.tag,CONCAT44(in_register_0000000c,argc));
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  s = *(JSGeneratorData **)((long)this_val.u.ptr + 0x30);
  *pdone = 1;
  if (s == (JSGeneratorData *)0x0) goto LAB_0015a932;
  JVar2 = s->state;
  if (JVar2 - JS_GENERATOR_STATE_SUSPENDED_YIELD < 2) {
    piVar8 = (int *)(argv->u).ptr;
    iVar3 = argv->tag;
    JVar9 = *argv;
    if (0xfffffff4 < (uint)iVar3) {
      *piVar8 = *piVar8 + 1;
    }
    if (JVar2 == JS_GENERATOR_STATE_SUSPENDED_YIELD && magic == 2) {
      JS_Throw(ctx,JVar9);
      BVar5 = 1;
    }
    else {
      pJVar4 = (s->func_state).frame.cur_sp;
      pJVar4[-1].u.ptr = piVar8;
      pJVar4[-1].tag = iVar3;
      pJVar4 = (s->func_state).frame.cur_sp;
      JVar6._4_4_ = 0;
      JVar6.int32 = magic;
      pJVar4->u = JVar6;
      pJVar4->tag = 0;
      ppJVar1 = &(s->func_state).frame.cur_sp;
      *ppJVar1 = *ppJVar1 + 1;
LAB_0015a9c4:
      BVar5 = 0;
    }
    (s->func_state).throw_flag = BVar5;
    s->state = JS_GENERATOR_STATE_EXECUTING;
    JVar9 = async_func_resume(ctx,&s->func_state);
    s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD;
    if ((int)JVar9.tag == 0) {
      pJVar4 = (s->func_state).frame.cur_sp;
      piVar8 = (int *)pJVar4[-1].u.ptr;
      iStack_40 = pJVar4[-1].tag;
      pJVar4[-1].u.int32 = 0;
      uVar7 = (ulong)piVar8 >> 0x20;
      pJVar4[-1].tag = 3;
      if (JVar9.u._0_4_ == 2) {
        s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR;
        *pdone = 2;
      }
      else {
        *pdone = 0;
      }
    }
    else {
      if ((int)JVar9.tag == 6) {
        free_generator_stack(ctx,s);
        return JVar9;
      }
      pJVar4 = (s->func_state).frame.cur_sp;
      piVar8 = (int *)pJVar4[-1].u.ptr;
      iStack_40 = pJVar4[-1].tag;
      uVar7 = (ulong)piVar8 >> 0x20;
      pJVar4[-1].u.int32 = 0;
      pJVar4[-1].tag = 3;
      JS_FreeValue(ctx,JVar9);
      free_generator_stack(ctx,s);
    }
  }
  else {
    if (JVar2 == JS_GENERATOR_STATE_EXECUTING) {
      JS_ThrowTypeError(ctx,"cannot invoke a running generator");
      iStack_40 = 6;
    }
    else {
      if (JVar2 != JS_GENERATOR_STATE_COMPLETED) {
        if (magic == 0) goto LAB_0015a9c4;
        free_generator_stack(ctx,s);
      }
      if (magic == 2) {
        JVar9 = *argv;
        if (0xfffffff4 < (uint)argv->tag) {
          *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
        }
        JS_Throw(ctx,JVar9);
        iStack_40 = 6;
      }
      else {
        if (magic == 1) {
          piVar8 = (int *)(argv->u).ptr;
          iStack_40 = argv->tag;
          if (0xfffffff4 < (uint)iStack_40) {
            *piVar8 = *piVar8 + 1;
          }
          uVar7 = (ulong)piVar8 >> 0x20;
          goto LAB_0015aaa5;
        }
        iStack_40 = 3;
      }
    }
    piVar8 = (int *)0x0;
    uVar7 = 0;
  }
LAB_0015aaa5:
  JVar9.tag = iStack_40;
  JVar9.u.ptr = (void *)((ulong)piVar8 & 0xffffffff | uVar7 << 0x20);
  return JVar9;
}

Assistant:

static JSValue js_generator_next(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 BOOL *pdone, int magic)
{
    JSGeneratorData *s = JS_GetOpaque(this_val, JS_CLASS_GENERATOR);
    JSStackFrame *sf;
    JSValue ret, func_ret;

    *pdone = TRUE;
    if (!s)
        return JS_ThrowTypeError(ctx, "not a generator");
    sf = &s->func_state.frame;
    switch(s->state) {
    default:
    case JS_GENERATOR_STATE_SUSPENDED_START:
        if (magic == GEN_MAGIC_NEXT) {
            goto exec_no_arg;
        } else {
            free_generator_stack(ctx, s);
            goto done;
        }
        break;
    case JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR:
    case JS_GENERATOR_STATE_SUSPENDED_YIELD:
        /* cur_sp[-1] was set to JS_UNDEFINED in the previous call */
        ret = JS_DupValue(ctx, argv[0]);
        if (magic == GEN_MAGIC_THROW &&
            s->state == JS_GENERATOR_STATE_SUSPENDED_YIELD) {
            JS_Throw(ctx, ret);
            s->func_state.throw_flag = TRUE;
        } else {
            sf->cur_sp[-1] = ret;
            sf->cur_sp[0] = JS_NewInt32(ctx, magic);
            sf->cur_sp++;
        exec_no_arg:
            s->func_state.throw_flag = FALSE;
        }
        s->state = JS_GENERATOR_STATE_EXECUTING;
        func_ret = async_func_resume(ctx, &s->func_state);
        s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD;
        if (JS_IsException(func_ret)) {
            /* finalize the execution in case of exception */
            free_generator_stack(ctx, s);
            return func_ret;
        }
        if (JS_VALUE_GET_TAG(func_ret) == JS_TAG_INT) {
            /* get the returned yield value at the top of the stack */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            if (JS_VALUE_GET_INT(func_ret) == FUNC_RET_YIELD_STAR) {
                s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR;
                /* return (value, done) object */
                *pdone = 2;
            } else {
                *pdone = FALSE;
            }
        } else {
            /* end of iterator */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            JS_FreeValue(ctx, func_ret);
            free_generator_stack(ctx, s);
        }
        break;
    case JS_GENERATOR_STATE_COMPLETED:
    done:
        /* execution is finished */
        switch(magic) {
        default:
        case GEN_MAGIC_NEXT:
            ret = JS_UNDEFINED;
            break;
        case GEN_MAGIC_RETURN:
            ret = JS_DupValue(ctx, argv[0]);
            break;
        case GEN_MAGIC_THROW:
            ret = JS_Throw(ctx, JS_DupValue(ctx, argv[0]));
            break;
        }
        break;
    case JS_GENERATOR_STATE_EXECUTING:
        ret = JS_ThrowTypeError(ctx, "cannot invoke a running generator");
        break;
    }
    return ret;
}